

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall presolve::HPresolve::scaleMIP(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  double *pdVar9;
  reference pvVar10;
  HPresolve *this_00;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar11;
  double extraout_XMM0_Qa;
  double scale_1;
  HighsSliceNonzero *nonz;
  iterator __end2;
  iterator __begin2;
  HighsTripletListSlice *__range2;
  double maxAbsVal_1;
  HighsInt i_1;
  double scale;
  HighsInt nzPos;
  size_t j;
  double maxAbsVal;
  HighsInt i;
  double in_stack_00000110;
  double in_stack_00000118;
  HighsInt in_stack_00000124;
  HighsPostsolveStack *in_stack_00000128;
  HPresolve *in_stack_00000130;
  HighsInt in_stack_ffffffffffffff0c;
  HPresolve *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff38;
  HPresolve *in_stack_ffffffffffffff40;
  iterator local_b8;
  iterator local_98;
  undefined1 in_stack_ffffffffffffff8f;
  double in_stack_ffffffffffffff90;
  HighsInt in_stack_ffffffffffffff9c;
  HPresolve *in_stack_ffffffffffffffa0;
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  int local_2c;
  ulong local_28;
  double local_20;
  int local_14;
  
  for (local_14 = 0; local_14 < *(int *)(*in_RDI + 4); local_14 = local_14 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                        (long)local_14);
    if ((*pvVar5 == '\0') &&
       (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_14),
       0 < *pvVar6)) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(long)local_14);
      iVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x26),(long)local_14);
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_14);
      if (iVar1 + iVar2 != *pvVar6) {
        storeRow(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_20 = 0.0;
        for (local_28 = 0; uVar3 = local_28,
            sVar7 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2c)), uVar3 < sVar7;
            local_28 = local_28 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2c),local_28);
          local_2c = *pvVar6;
          in_stack_ffffffffffffff10 = (HPresolve *)(*in_RDI + 0x178);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_2c);
          pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              in_stack_ffffffffffffff10,(long)*pvVar6);
          if (*pvVar8 == kContinuous) {
            this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 5);
            std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_2c);
            std::abs((int)this_01);
            pdVar9 = std::max<double>(&local_38,&local_20);
            local_20 = *pdVar9;
          }
        }
        dVar11 = log2(local_20);
        dVar11 = round(-dVar11);
        local_40 = exp2(dVar11);
        if ((local_40 != 1.0) || (NAN(local_40))) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                               (long)local_14);
          if ((*pvVar10 == INFINITY) && (!NAN(*pvVar10))) {
            local_40 = -local_40;
          }
          scaleStoredRow(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                         in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
        }
      }
    }
  }
  for (local_44 = 0; local_44 < *(int *)*in_RDI; local_44 = local_44 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                        (long)local_44);
    if (((*pvVar5 == '\0') &&
        (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)local_44),
        0 < *pvVar6)) &&
       (pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178)
                            ,(long)local_44), *pvVar8 == kContinuous)) {
      local_50 = 0.0;
      getColumnVector(in_stack_ffffffffffffff40,(HighsInt)((ulong)in_stack_ffffffffffffff38 >> 0x20)
                     );
      HighsMatrixSlice<HighsTripletListSlice>::begin
                ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_ffffffffffffff10);
      HighsMatrixSlice<HighsTripletListSlice>::end
                ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_ffffffffffffff10);
      while (bVar4 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=
                               (&local_98,&local_b8), bVar4) {
        this_00 = (HPresolve *)
                  HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_98);
        in_stack_ffffffffffffff40 = this_00;
        HighsSliceNonzero::value((HighsSliceNonzero *)this_00);
        std::abs((int)this_00);
        in_stack_ffffffffffffff38 = extraout_XMM0_Qa;
        pdVar9 = std::max<double>((double *)&stack0xffffffffffffff38,&local_50);
        local_50 = *pdVar9;
        HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_98);
      }
      dVar11 = log2(local_50);
      dVar11 = round(-dVar11);
      dVar11 = exp2(dVar11);
      if ((dVar11 != 1.0) || (NAN(dVar11))) {
        transformColumn(in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000118,
                        in_stack_00000110);
      }
    }
  }
  return;
}

Assistant:

void HPresolve::scaleMIP(HighsPostsolveStack& postsolve_stack) {
  for (HighsInt i = 0; i < model->num_row_; ++i) {
    if (rowDeleted[i] || rowsize[i] < 1 ||
        rowsizeInteger[i] + rowsizeImplInt[i] == rowsize[i])
      continue;

    storeRow(i);

    double maxAbsVal = 0.0;

    for (size_t j = 0; j < rowpositions.size(); ++j) {
      HighsInt nzPos = rowpositions[j];
      if (model->integrality_[Acol[nzPos]] != HighsVarType::kContinuous)
        continue;

      maxAbsVal = std::max(std::abs(Avalue[nzPos]), maxAbsVal);
    }

    assert(maxAbsVal != 0.0);

    double scale = std::exp2(std::round(-std::log2(maxAbsVal)));
    if (scale == 1.0) continue;

    if (model->row_upper_[i] == kHighsInf) scale = -scale;

    scaleStoredRow(i, scale);
  }

  for (HighsInt i = 0; i < model->num_col_; ++i) {
    if (colDeleted[i] || colsize[i] < 1 ||
        model->integrality_[i] != HighsVarType::kContinuous)
      continue;

    double maxAbsVal = 0;

    for (const HighsSliceNonzero& nonz : getColumnVector(i)) {
      maxAbsVal = std::max(std::abs(nonz.value()), maxAbsVal);
    }

    double scale = std::exp2(std::round(-std::log2(maxAbsVal)));
    if (scale == 1.0) continue;

    transformColumn(postsolve_stack, i, scale, 0.0);
  }
}